

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O0

Real __thiscall amrex::MLCellLinOp::AnyNormInfMask(MLCellLinOp *this,int amrlev,Any *a,bool local)

{
  longdouble x;
  bool bVar1;
  FabFactory<amrex::FArrayBox> *pFVar2;
  double *pdVar3;
  byte in_CL;
  int in_ESI;
  MLLinOp *in_RDI;
  MLLinOp *this_00;
  iMultiFab *fine_mask;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  Array4<const_double> *v_1;
  Array4<const_int> *mask;
  Array4<const_double> *fab_1;
  Box *bx_1;
  MFIter mfi_1;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *v;
  Array4<const_double> *fab;
  Box *bx;
  MFIter mfi;
  MultiFab *vfrac;
  EBFArrayBoxFactory *factory;
  int ncomp;
  Real norm;
  int finest_level;
  MultiFab *mf;
  int mglev;
  MPI_Comm amr_lev;
  undefined2 uVar4;
  undefined6 in_stack_fffffffffffffa02;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffa08;
  undefined8 in_stack_fffffffffffffa20;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_fffffffffffffa28;
  undefined8 *puVar5;
  MFIter *in_stack_fffffffffffffa30;
  undefined1 *puVar6;
  Any *in_stack_fffffffffffffa38;
  long *plVar7;
  MFIter *in_stack_fffffffffffffa60;
  MFIter *this_01;
  undefined8 local_580;
  double local_560;
  int local_558;
  int local_554;
  int local_550;
  int local_54c;
  undefined8 local_548;
  int local_540;
  undefined8 local_534;
  int local_52c;
  undefined8 local_528;
  int local_520;
  undefined8 local_518;
  int local_510;
  undefined1 local_508 [64];
  undefined1 *local_4c8;
  long local_4c0 [8];
  long *local_480;
  undefined1 local_478 [64];
  undefined1 *local_438;
  undefined8 local_42c [3];
  undefined8 *local_410;
  MFIter local_408;
  double local_398;
  int local_390;
  int local_38c;
  int local_388;
  int local_384;
  undefined8 local_380;
  int local_378;
  undefined8 local_36c;
  int local_364;
  FabArrayBase *local_360;
  int local_358;
  undefined8 local_350;
  int local_348;
  undefined1 local_340 [64];
  undefined1 *local_300;
  undefined1 local_2f8 [15];
  undefined1 in_stack_fffffffffffffd17;
  iMultiFab *in_stack_fffffffffffffd18;
  MultiFab *in_stack_fffffffffffffd20;
  MLLinOp *in_stack_fffffffffffffd28;
  undefined1 local_2ac [36];
  MFIter local_288;
  MultiFab *local_228;
  undefined8 local_220;
  int local_214;
  double local_210;
  int local_204;
  MultiFab *local_200;
  byte local_1f1;
  int local_1e4;
  undefined8 local_1d8;
  int local_1d0;
  undefined8 *local_1c8;
  undefined4 local_1bc;
  undefined4 uStack_1b8;
  int local_1b4;
  FabArrayBase *local_1b0;
  int local_1a8;
  MFIter *local_1a0;
  undefined4 local_194;
  undefined4 uStack_190;
  int local_18c;
  undefined8 local_188;
  int local_180;
  undefined8 *local_178;
  undefined4 local_16c;
  undefined4 uStack_168;
  int local_164;
  undefined8 local_160;
  int local_158;
  MFIter *local_150;
  undefined4 local_144;
  int iStack_140;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  undefined1 *local_128;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  undefined1 *local_110;
  undefined4 local_104;
  undefined1 *local_100;
  undefined4 local_f4;
  undefined1 *local_f0;
  undefined4 local_e4;
  undefined8 *local_e0;
  undefined4 local_d4;
  undefined4 *local_d0;
  undefined4 local_c4;
  undefined4 *local_c0;
  undefined4 local_b4;
  undefined8 *local_b0;
  undefined4 local_a4;
  MFIter *local_a0;
  undefined4 local_94;
  MFIter *local_90;
  undefined4 local_84;
  MFIter *local_80;
  undefined4 local_74;
  undefined8 *local_70;
  undefined4 local_64;
  undefined8 *local_60;
  undefined4 local_54;
  undefined8 *local_50;
  int local_44;
  int local_40;
  int local_3c;
  undefined1 *local_38;
  int local_2c;
  int local_28;
  int local_24;
  undefined1 *local_20;
  int local_14;
  int local_10;
  int local_c;
  long *local_8;
  
  do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffffa20 >> 0x38);
  local_1f1 = in_CL & 1;
  local_1e4 = in_ESI;
  local_200 = Any::get<amrex::MultiFab>(in_stack_fffffffffffffa38);
  this_00 = in_RDI;
  local_204 = MLLinOp::NAMRLevels(in_RDI);
  local_204 = local_204 + -1;
  x = (longdouble)0;
  mglev = SUB104(x,0);
  amr_lev = (MPI_Comm)((unkuint10)x >> 0x20);
  uVar4 = (undefined2)((unkuint10)x >> 0x40);
  local_210 = literals::operator____rt((literals *)this_00,x);
  local_214 = (*in_RDI->_vptr_MLLinOp[5])();
  bVar1 = FabArray<amrex::FArrayBox>::isAllRegular(in_stack_fffffffffffffa08);
  if (bVar1) {
    if (local_1e4 != local_204) {
      Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                    *)CONCAT62(in_stack_fffffffffffffa02,uVar4),CONCAT44(amr_lev,mglev));
      std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::get
                ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                 CONCAT62(in_stack_fffffffffffffa02,uVar4));
    }
    local_210 = MLLinOp::MFNormInf(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
                                   in_stack_fffffffffffffd18,(bool)in_stack_fffffffffffffd17);
  }
  else {
    pFVar2 = MLLinOp::Factory((MLLinOp *)CONCAT62(in_stack_fffffffffffffa02,uVar4),amr_lev,mglev);
    if (pFVar2 == (FabFactory<amrex::FArrayBox> *)0x0) {
      local_580 = 0;
    }
    else {
      local_580 = __dynamic_cast(pFVar2,&FabFactory<amrex::FArrayBox>::typeinfo,
                                 &EBFArrayBoxFactory::typeinfo,0);
    }
    local_220 = local_580;
    local_228 = EBFArrayBoxFactory::getVolFrac
                          ((EBFArrayBoxFactory *)CONCAT62(in_stack_fffffffffffffa02,uVar4));
    if (local_1e4 == local_204) {
      MFIter::MFIter(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,(bool)do_tiling_);
      while (bVar1 = MFIter::isValid(&local_288), bVar1) {
        this_01 = (MFIter *)local_2ac;
        MFIter::tilebox(this_01);
        local_2ac._28_8_ = this_01;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffffa08,(MFIter *)CONCAT62(in_stack_fffffffffffffa02,uVar4));
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffffa08,(MFIter *)CONCAT62(in_stack_fffffffffffffa02,uVar4));
        local_1a0 = (MFIter *)local_2ac._28_8_;
        local_80 = (MFIter *)local_2ac._28_8_;
        local_84 = 0;
        local_194 = *(undefined4 *)
                     &(((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                         *)local_2ac._28_8_)->_M_t).
                      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                      .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
        local_90 = (MFIter *)local_2ac._28_8_;
        local_94 = 1;
        uStack_190 = *(undefined4 *)
                      ((long)&(((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                 *)local_2ac._28_8_)->_M_t).
                              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 4)
        ;
        local_360 = (((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> *)
                     local_2ac._28_8_)->_M_t).
                    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                    .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
        local_a0 = (MFIter *)local_2ac._28_8_;
        local_a4 = 2;
        local_358 = *(int *)(local_2ac._28_8_ + 8);
        local_150 = (MFIter *)local_2ac._28_8_;
        local_e0 = (undefined8 *)((long)(local_2ac._28_8_ + 8) + 4);
        local_e4 = 0;
        local_144 = *(undefined4 *)local_e0;
        local_f0 = (undefined1 *)((long)(local_2ac._28_8_ + 8) + 4);
        local_f4 = 1;
        iStack_140 = ((IntVect *)(local_2ac._28_8_ + 0x10))->vect[0];
        local_380 = *local_e0;
        local_100 = (undefined1 *)((long)(local_2ac._28_8_ + 8) + 4);
        local_104 = 2;
        local_378 = ((IntVect *)(local_2ac._28_8_ + 0x10))->vect[1];
        local_36c = local_380;
        local_364 = local_378;
        local_350 = local_360;
        local_348 = local_358;
        local_300 = local_340;
        local_1b0 = local_360;
        local_1a8 = local_358;
        local_18c = local_358;
        local_160 = local_380;
        local_158 = local_378;
        local_13c = local_378;
        for (local_384 = 0; local_384 < local_214; local_384 = local_384 + 1) {
          for (local_388 = local_348; local_388 <= local_364; local_388 = local_388 + 1) {
            for (local_38c = local_350._4_4_; local_38c <= local_36c._4_4_;
                local_38c = local_38c + 1) {
              for (local_390 = (int)local_350; local_390 <= (int)local_36c;
                  local_390 = local_390 + 1) {
                local_114 = local_390;
                local_118 = local_38c;
                local_11c = local_388;
                local_120 = local_384;
                local_20 = local_300;
                local_24 = local_390;
                local_28 = local_38c;
                local_2c = local_388;
                local_110 = local_2f8;
                std::abs(*(int *)(local_300 + 0x28));
                pdVar3 = std::max<double>(&local_210,&local_398);
                local_210 = *pdVar3;
              }
            }
          }
        }
        MFIter::operator++(&local_288);
      }
      MFIter::~MFIter((MFIter *)CONCAT62(in_stack_fffffffffffffa02,uVar4));
    }
    else {
      MFIter::MFIter(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,(bool)do_tiling_);
      while (bVar1 = MFIter::isValid(&local_408), bVar1) {
        puVar5 = local_42c;
        MFIter::tilebox(in_stack_fffffffffffffa60);
        puVar6 = local_478;
        local_410 = puVar5;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffffa08,(MFIter *)CONCAT62(in_stack_fffffffffffffa02,uVar4));
        local_438 = puVar6;
        Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                      *)CONCAT62(in_stack_fffffffffffffa02,uVar4),CONCAT44(amr_lev,mglev));
        std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator->
                  ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)0x15324ef
                  );
        plVar7 = local_4c0;
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  ((FabArray<amrex::IArrayBox> *)in_stack_fffffffffffffa08,
                   (MFIter *)CONCAT62(in_stack_fffffffffffffa02,uVar4));
        local_480 = plVar7;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffffa08,(MFIter *)CONCAT62(in_stack_fffffffffffffa02,uVar4));
        local_1c8 = local_410;
        local_50 = local_410;
        local_54 = 0;
        local_1bc = *(undefined4 *)local_410;
        local_60 = local_410;
        local_64 = 1;
        uStack_1b8 = *(undefined4 *)((long)local_410 + 4);
        local_528 = *local_410;
        local_70 = local_410;
        local_74 = 2;
        local_520 = *(int *)(local_410 + 1);
        local_178 = local_410;
        local_b0 = (undefined8 *)((long)local_410 + 0xc);
        local_b4 = 0;
        local_16c = *(undefined4 *)local_b0;
        local_c0 = (undefined4 *)((long)local_410 + 0xc);
        local_c4 = 1;
        uStack_168 = *(undefined4 *)(local_410 + 2);
        local_548 = *local_b0;
        local_d0 = (undefined4 *)((long)local_410 + 0xc);
        local_d4 = 2;
        local_540 = *(int *)((long)local_410 + 0x14);
        local_534 = local_548;
        local_52c = local_540;
        local_518 = local_528;
        local_510 = local_520;
        local_4c8 = local_508;
        local_1d8 = local_528;
        local_1d0 = local_520;
        local_1b4 = local_520;
        local_188 = local_548;
        local_180 = local_540;
        local_164 = local_540;
        for (local_54c = 0; local_54c < local_214; local_54c = local_54c + 1) {
          for (local_550 = local_510; local_550 <= local_52c; local_550 = local_550 + 1) {
            for (local_554 = local_518._4_4_; local_554 <= local_534._4_4_;
                local_554 = local_554 + 1) {
              for (local_558 = (int)local_518; local_558 <= (int)local_534;
                  local_558 = local_558 + 1) {
                local_8 = local_480;
                local_c = local_558;
                local_10 = local_554;
                local_14 = local_550;
                if (*(int *)(*local_480 +
                            ((long)(local_558 - (int)local_480[4]) +
                             (long)(local_554 - *(int *)((long)local_480 + 0x24)) * local_480[1] +
                            (long)(local_550 - (int)local_480[5]) * local_480[2]) * 4) != 0) {
                  local_128 = local_438;
                  local_12c = local_558;
                  local_130 = local_554;
                  local_134 = local_550;
                  local_138 = local_54c;
                  local_38 = local_4c8;
                  local_3c = local_558;
                  local_40 = local_554;
                  local_44 = local_550;
                  std::abs(*(int *)(local_4c8 + 0x28));
                  pdVar3 = std::max<double>(&local_210,&local_560);
                  local_210 = *pdVar3;
                }
              }
            }
          }
        }
        MFIter::operator++(&local_408);
      }
      MFIter::~MFIter((MFIter *)CONCAT62(in_stack_fffffffffffffa02,uVar4));
    }
  }
  if ((local_1f1 & 1) == 0) {
    ParallelContext::CommunicatorSub();
    ParallelAllReduce::Max<double>((double *)CONCAT62(in_stack_fffffffffffffa02,uVar4),amr_lev);
  }
  return local_210;
}

Assistant:

Real
MLCellLinOp::AnyNormInfMask (int amrlev, Any const& a, bool local) const
{
    AMREX_ASSERT(a.is<MultiFab>());
    auto& mf = a.get<MultiFab>();

    const int finest_level = NAMRLevels() - 1;
    Real norm = 0._rt;
#ifdef AMREX_USE_EB
    const int ncomp = getNComp();
    if (! mf.isAllRegular()) {
        auto factory = dynamic_cast<EBFArrayBoxFactory const*>(Factory(amrlev));
        const MultiFab& vfrac = factory->getVolFrac();
        if (amrlev == finest_level) {
#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion()) {
                auto const& ma = mf.const_arrays();
                auto const& vfrac_ma = vfrac.const_arrays();
                norm = ParReduce(TypeList<ReduceOpMax>{}, TypeList<Real>{},
                                 mf, IntVect(0), ncomp,
                                 [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n)
                                     -> GpuTuple<Real>
                                 {
                                     return amrex::Math::abs(ma[box_no](i,j,k,n)
                                                             *vfrac_ma[box_no](i,j,k));
                                 });
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:norm)
#endif
                for (MFIter mfi(mf,true); mfi.isValid(); ++mfi) {
                    Box const& bx = mfi.tilebox();
                    auto const& fab = mf.const_array(mfi);
                    auto const& v = vfrac.const_array(mfi);
                    AMREX_LOOP_4D(bx, ncomp, i, j, k, n,
                    {
                        norm = std::max(norm, amrex::Math::abs(fab(i,j,k,n)*v(i,j,k)));
                    });
                }
            }
        } else {
#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion()) {
                auto const& ma = mf.const_arrays();
                auto const& mask_ma = m_norm_fine_mask[amrlev]->const_arrays();
                auto const& vfrac_ma = vfrac.const_arrays();
                norm = ParReduce(TypeList<ReduceOpMax>{}, TypeList<Real>{},
                                 mf, IntVect(0), ncomp,
                                 [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n)
                                     -> GpuTuple<Real>
                                 {
                                     if (mask_ma[box_no](i,j,k)) {
                                         return amrex::Math::abs(ma[box_no](i,j,k,n)
                                                                 *vfrac_ma[box_no](i,j,k));
                                     } else {
                                         return Real(0.0);
                                     }
                                 });
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:norm)
#endif
                for (MFIter mfi(mf,true); mfi.isValid(); ++mfi) {
                    Box const& bx = mfi.tilebox();
                    auto const& fab = mf.const_array(mfi);
                    auto const& mask = m_norm_fine_mask[amrlev]->const_array(mfi);
                    auto const& v = vfrac.const_array(mfi);
                    AMREX_LOOP_4D(bx, ncomp, i, j, k, n,
                    {
                        if (mask(i,j,k)) {
                            norm = std::max(norm, amrex::Math::abs(fab(i,j,k,n)*v(i,j,k)));
                        }
                    });
                }
            }
        }
    } else
#endif
    {
        iMultiFab const* fine_mask = (amrlev == finest_level)
            ? nullptr : m_norm_fine_mask[amrlev].get();
        norm = MFNormInf(mf, fine_mask, true);
    }

    if (!local) ParallelAllReduce::Max(norm, ParallelContext::CommunicatorSub());
    return norm;
}